

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O3

void fm_quatToMatrix(float *quat,float *matrix)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  fVar1 = quat[1];
  fVar2 = quat[2];
  fVar3 = *quat;
  fVar4 = quat[3];
  auVar9 = SUB6416(ZEXT464(0x3f800000),0);
  auVar10 = SUB6416(ZEXT464(0xc0000000),0);
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2)),auVar10,auVar9);
  *matrix = auVar8._0_4_;
  fVar6 = fVar3 * fVar1 - fVar4 * fVar2;
  fVar5 = fVar3 * fVar1 + fVar4 * fVar2;
  matrix[4] = fVar6 + fVar6;
  fVar6 = fVar3 * fVar2 + fVar4 * fVar1;
  fVar7 = fVar3 * fVar2 - fVar4 * fVar1;
  matrix[8] = fVar6 + fVar6;
  matrix[1] = fVar5 + fVar5;
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * fVar3 + fVar2 * fVar2)),auVar10,auVar9);
  matrix[5] = auVar8._0_4_;
  fVar5 = fVar1 * fVar2 - fVar4 * fVar3;
  fVar2 = fVar1 * fVar2 + fVar4 * fVar3;
  matrix[9] = fVar5 + fVar5;
  matrix[2] = fVar7 + fVar7;
  matrix[6] = fVar2 + fVar2;
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * fVar3 + fVar1 * fVar1)),auVar10,auVar9);
  matrix[10] = auVar8._0_4_;
  matrix[7] = 0.0;
  matrix[3] = 0.0;
  *(undefined1 (*) [16])(matrix + 0xb) = ZEXT816(0) << 0x20;
  matrix[0xf] = 1.0;
  return;
}

Assistant:

void fm_quatToMatrix(const float *quat,float *matrix) // convert quaternion rotation to matrix, zeros out the translation component.
{

	float xx = quat[0]*quat[0];
	float yy = quat[1]*quat[1];
	float zz = quat[2]*quat[2];
	float xy = quat[0]*quat[1];
	float xz = quat[0]*quat[2];
	float yz = quat[1]*quat[2];
	float wx = quat[3]*quat[0];
	float wy = quat[3]*quat[1];
	float wz = quat[3]*quat[2];

	matrix[0*4+0] = 1 - 2 * ( yy + zz );
	matrix[1*4+0] =     2 * ( xy - wz );
	matrix[2*4+0] =     2 * ( xz + wy );

	matrix[0*4+1] =     2 * ( xy + wz );
	matrix[1*4+1] = 1 - 2 * ( xx + zz );
	matrix[2*4+1] =     2 * ( yz - wx );

	matrix[0*4+2] =     2 * ( xz - wy );
	matrix[1*4+2] =     2 * ( yz + wx );
	matrix[2*4+2] = 1 - 2 * ( xx + yy );

	matrix[3*4+0] = matrix[3*4+1] = matrix[3*4+2] = 0.0f;
	matrix[0*4+3] = matrix[1*4+3] = matrix[2*4+3] = 0.0f;
	matrix[3*4+3] = 1.0f;

}